

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe8At2(uint8_t *buf)

{
  uint64_t res;
  uint8_t *buf_local;
  
  return (long)((int)(uint)buf[1] >> 6) | ((ulong)*buf & 0x3f) << 2;
}

Assistant:

std::uint64_t readFlUIntBe8At2(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 2;
    res |= (buf[1] >> 6);
    res &= UINT64_C(0xff);
    return res;
}